

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobj.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ushort uVar1;
  void *this;
  Am_Object *pAVar2;
  undefined8 uVar3;
  Am_Value_List *this_00;
  Am_Wrapper *pAVar4;
  char *pcVar5;
  ostream *poVar6;
  Am_Method_Wrapper *pAVar7;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object quit_button;
  Am_Object local_a8;
  Am_Object send_button;
  Am_Object local_98;
  Am_Object send_cmd;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object mg_inter_inst;
  Am_Object local_70;
  Am_String local_68 [8];
  Am_Value_List local_60 [16];
  Am_Object local_50;
  Am_Object local_48;
  Am_Object proto_rect;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object my_win;
  char **argv_local;
  int argc_local;
  
  my_win.data = (Am_Object_Data *)argv;
  Am_Initialize();
  this = (void *)std::ostream::operator<<(&std::cout,argc);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if (argc == 2) {
    remote_host = *(char **)(my_win.data + 8);
  }
  else {
    remote_host = remote_host_data;
    sprintf(remote_host_data,"basalt.amulet.cs.cmu.edu");
  }
  mc = (Am_Connection *)Am_Connection::Open(remote_host);
  Am_Connection::Register_Receiver((Am_Receive_Method *)mc);
  Am_Object::Create((char *)&local_28);
  uVar1 = Am_Object::Set((ushort)&local_28,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0x66,200);
  Am_Object::Am_Object(&local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&proto_rect,(Am_Object *)&local_20);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&proto_rect,0),1);
  Am_Object::~Am_Object(&proto_rect);
  Am_Object::Create((char *)&local_50);
  uVar1 = Am_Object::Set((ushort)&local_50,0x67,0x14);
  uVar1 = Am_Object::Set(uVar1,0x66,0x14);
  Am_Value_List::Am_Value_List(local_60);
  uVar3 = Am_Value_List::Add(local_60,100,1);
  this_00 = (Am_Value_List *)Am_Value_List::Add(uVar3,0x65,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(this_00);
  pAVar2 = (Am_Object *)Am_Object::Add(uVar1,(Am_Wrapper *)0xb8,(ulong)pAVar4);
  Am_Object::Am_Object(&local_48,pAVar2);
  Am_Value_List::~Am_Value_List(local_60);
  Am_Object::~Am_Object(&local_50);
  Am_String::Am_String(local_68,"net_rect",true);
  Am_Connection::Register_Prototype(local_68,&local_48);
  Am_String::~Am_String(local_68);
  pcVar5 = (char *)Am_Connection::Get_Net_Proto_Name((Am_Object *)&local_48);
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::operator<<(poVar6,"#\n");
  Am_Connection::Get_Net_Prototype((char *)&local_70);
  poVar6 = (ostream *)operator<<((ostream *)&std::cout,(Am_Object *)&local_70);
  std::operator<<(poVar6,"#\n");
  Am_Object::~Am_Object(&local_70);
  Am_Object::Create((char *)&mg_inter_inst);
  uVar1 = Am_Object::Set((ushort)&mg_inter_inst,0x65,10);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,100,10);
  Am_Object::operator=(&rectangle,pAVar2);
  Am_Object::~Am_Object(&mg_inter_inst);
  Am_Object::Create((char *)&local_80);
  Am_Object::Am_Object(&local_88,(Am_Object *)&local_80);
  Am_Object::Add_Part((Am_Object *)&local_20,SUB81(&local_88,0),1);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&send_cmd,(Am_Object *)&rectangle);
  Am_Object::Add_Part((Am_Object *)&local_20,SUB81(&send_cmd,0),1);
  Am_Object::~Am_Object(&send_cmd);
  Am_Object::Create((char *)&send_button);
  uVar1 = Am_Object::Set((ushort)&send_button,(char *)0x150,0x104054);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&net_obj_method);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar7);
  Am_Object::Am_Object(&local_98,pAVar2);
  Am_Object::~Am_Object(&send_button);
  Am_Object::Create((char *)&quit_button);
  uVar1 = Am_Object::Set((ushort)&quit_button,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xc5,(ulong)pAVar4);
  Am_Object::Am_Object(&local_a8,pAVar2);
  Am_Object::~Am_Object(&quit_button);
  Am_Object::Create((char *)&local_c0);
  uVar1 = Am_Object::Set((ushort)&local_c0,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x8c);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_Quit_No_Ask_Command);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xc5,(ulong)pAVar4);
  Am_Object::Am_Object(&local_b8,pAVar2);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::Am_Object(&local_c8,(Am_Object *)&local_a8);
  Am_Object::Add_Part((Am_Object *)&local_20,SUB81(&local_c8,0),1);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::Am_Object(&local_d0,(Am_Object *)&local_b8);
  Am_Object::Add_Part((Am_Object *)&local_20,SUB81(&local_d0,0),1);
  Am_Object::~Am_Object(&local_d0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_20);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  Am_Initialize();

  cout << argc << endl;
  if (argc != 2) {
    remote_host = remote_host_data;
    sprintf(remote_host, "basalt.amulet.cs.cmu.edu");
  } else
    remote_host = argv[1];

  mc = Am_Connection::Open(remote_host);
  mc->Register_Receiver(test_receive);

  Am_Object my_win = Am_Window.Create("my_win")
                         .Set(Am_LEFT, 20)
                         .Set(Am_TOP, 50)
                         .Set(Am_HEIGHT, 200)
                         .Set(Am_WIDTH, 200);

  Am_Screen.Add_Part(my_win);

  Am_Object proto_rect =
      Am_Rectangle.Create("proto rect")
          .Set(Am_HEIGHT, 20)
          .Set(Am_WIDTH, 20)
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_LEFT).Add(Am_TOP));

  Am_Connection::Register_Prototype("net_rect", proto_rect);
  cout << Am_Connection::Get_Net_Proto_Name(proto_rect) << "#\n";
  cout << Am_Connection::Get_Net_Prototype("net_rect") << "#\n";

  rectangle = proto_rect.Create("rect_inst").Set(Am_TOP, 10).Set(Am_LEFT, 10);

  Am_Object mg_inter_inst = Am_Move_Grow_Interactor.Create("mover");
  //    .Set(Am_DO_METHOD,edit_update_method);

  my_win.Add_Part(mg_inter_inst);
  my_win.Add_Part(rectangle);

  Am_Object send_cmd = Am_Command.Create("send cmd")
                           .Set(Am_LABEL, "Send Object!")
                           .Set(Am_DO_METHOD, net_obj_method);

  Am_Object send_button = Am_Button.Create("send_button")
                              .Set(Am_LEFT, 20)
                              .Set(Am_TOP, 50)
                              .Set(Am_COMMAND, send_cmd);

  Am_Object quit_button = Am_Button.Create("quit_button")
                              .Set(Am_LEFT, 20)
                              .Set(Am_TOP, 140)
                              .Set(Am_COMMAND, Am_Quit_No_Ask_Command);
  my_win.Add_Part(send_button);
  my_win.Add_Part(quit_button);

  /* ************************************************************ */
  /* End user code                                                */
  /* ************************************************************ */

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}